

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O0

void encode_smallExample_isSuccessful(void)

{
  bech32_error bVar1;
  int iVar2;
  size_t hrplen;
  bech32_bstring *bstring_00;
  bech32_bstring *bstring;
  char expected [14];
  uchar dp [3];
  char hrp [4];
  
  builtin_strncpy(expected + 6,"\x01\x02\x03xyz",7);
  stack0xffffffffffffffe3 = 0x73727a70317a7978;
  builtin_strncpy(expected,"3usye",6);
  hrplen = strlen(expected + 9);
  bstring_00 = bech32_create_bstring(hrplen,3);
  bVar1 = bech32_encode(bstring_00,expected + 9,(uchar *)(expected + 6),3);
  if (bVar1 != E_BECH32_SUCCESS) {
    __assert_fail("bech32_encode(bstring, hrp, dp, sizeof(dp)) == E_BECH32_SUCCESS",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x11b,"void encode_smallExample_isSuccessful(void)");
  }
  iVar2 = strcmp((char *)((long)&bstring + 3),bstring_00->string);
  if (iVar2 == 0) {
    bech32_free_bstring(bstring_00);
    return;
  }
  __assert_fail("strcmp(expected, bstring->string) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x11c,"void encode_smallExample_isSuccessful(void)");
}

Assistant:

void encode_smallExample_isSuccessful(void) {
    char hrp[] = "xyz";
    unsigned char dp[] = {1,2,3};
    char expected[] = "xyz1pzrs3usye";
    bech32_bstring *bstring = bech32_create_bstring(strlen(hrp), sizeof(dp));

    assert(bech32_encode(bstring, hrp, dp, sizeof(dp)) == E_BECH32_SUCCESS);
    assert(strcmp(expected, bstring->string) == 0);

    bech32_free_bstring(bstring);
}